

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_key_encode_decode.cpp
# Opt level: O2

void __thiscall
anon_unknown.dwarf_8dc4::ARTKeyEncodeDecodeTest_C00002_Test::~ARTKeyEncodeDecodeTest_C00002_Test
          (ARTKeyEncodeDecodeTest_C00002_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

UNODB_TEST(ARTKeyEncodeDecodeTest, C00002) {
  unodb::key_encoder enc{};
  UNODB_EXPECT_EQ(enc.capacity(), INITIAL_CAPACITY);
  UNODB_EXPECT_EQ(enc.size_bytes(), 0);
  // ensure some space is available w/o change in encoder.
  enc.ensure_available(INITIAL_CAPACITY + 1);  // edge case.
  UNODB_EXPECT_EQ(enc.capacity(),
                  INITIAL_CAPACITY * 2);  // assumes power of two
  UNODB_EXPECT_EQ(enc.size_bytes(), 0);
  UNODB_EXPECT_EQ(enc.get_key_view().size_bytes(), 0);  // key_view is empty
  // reset.
  enc.reset();
  UNODB_EXPECT_EQ(enc.capacity(), INITIAL_CAPACITY * 2);  // unchanged
  UNODB_EXPECT_EQ(enc.size_bytes(), 0);                   // reset
  UNODB_EXPECT_EQ(enc.get_key_view().size_bytes(), 0);    // key_view is empty
}